

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<short,unsigned_int>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  uint uVar2;
  uint u;
  uint local_34;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2e;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  
  u = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_int>(&local_2e,&u);
  su.m_int = u;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_int>(&st2,&su);
  local_2e.m_int = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_2e,&u);
  if (su.m_int < 0x8000) {
    local_2e.m_int = st2.m_int;
    SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_2e);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator*(&local_2e,st2);
    operator*(u,local_2e);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,su);
    uVar2 = 1;
    u = uVar2;
    local_34 = uVar2;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,(int *)&local_34);
    local_34 = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_34);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    local_34 = uVar2;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_34);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator%(&local_2e,st2);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,su);
    u = uVar2;
    local_34 = uVar2;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_34);
    local_34 = uVar2;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,(int *)&local_34);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator/(&local_2e,st2);
    operator/(u,local_2e);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator+(&local_2e,st2);
    operator+(u,local_2e);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,su);
    local_34 = 0;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,(int *)&local_34);
    u = 0;
    local_34 = 0;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_34);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator-(&local_2e,st2);
    operator-(u,local_2e);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    local_34 = uVar2;
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,(int *)&local_34);
    local_34 = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_34);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,su);
    u = uVar2;
    local_34 = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_34);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator<<((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_2e,su);
    operator<<(SVar1.m_int,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2e,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2e,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
              ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2e,u);
    SVar1 = SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator>>((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_2e,su);
    operator>>(SVar1.m_int,su);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2e,u);
    SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                 *)&local_2e,su);
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    operator&(&local_2e,st2);
    local_34 = BinaryAndHelper<unsigned_int,_short,_2>::And(su.m_int,local_2e.m_int & (ushort)u);
    SafeInt::operator_cast_to_short((SafeInt *)&local_34);
    local_2e.m_int = (ushort)su.m_int & (ushort)u & local_2e.m_int & st2.m_int;
    local_34 = BinaryOrHelper<unsigned_int,_short,_2>::Or(su.m_int,(ushort)u);
    SafeInt::operator_cast_to_short((SafeInt *)&local_34);
    local_2e.m_int = (ushort)su.m_int | (ushort)u | local_2e.m_int | st2.m_int;
    local_34 = BinaryXorHelper<unsigned_int,_short,_2>::Xor(su.m_int,local_2e.m_int ^ (ushort)u);
    SafeInt::operator_cast_to_short((SafeInt *)&local_34);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}